

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::TextureMipmapTests::init(TextureMipmapTests *this,EVP_PKEY_CTX *ctx)

{
  CoordType coordType;
  TestContext *pTVar1;
  char *pcVar2;
  Context *pCVar3;
  RenderContext *pRVar4;
  ContextInfo *renderCtxInfo;
  TestNode *pTVar5;
  TestNode *node;
  TestNode *pTVar6;
  ostream *poVar7;
  Texture2DMipmapCase *pTVar8;
  long lVar9;
  long lVar10;
  Texture2DGenMipmapCase *this_00;
  TextureCubeMipmapCase *this_01;
  anon_struct_16_3_5cb0d78b *extraout_RAX;
  anon_struct_16_3_5cb0d78b *paVar11;
  TextureCubeGenMipmapCase *this_02;
  long lVar12;
  long lVar13;
  char *local_1d8 [4];
  long local_1b8;
  long local_1b0;
  ostringstream name;
  
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Mipmapping");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cube Map Filtering");
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  tcu::TestNode::addChild((TestNode *)this,node);
  lVar12 = 0;
  while( true ) {
    pTVar6 = (TestNode *)operator_new(0x70);
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (lVar12 == 3) break;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,pTVar1,init::coordTypes[lVar12].name,
               init::coordTypes[lVar12].desc);
    tcu::TestNode::addChild(pTVar5,pTVar6);
    coordType = init::coordTypes[lVar12].type;
    lVar10 = 0;
    while (lVar10 != 4) {
      lVar9 = 0;
      local_1b8 = lVar10;
      while (lVar9 != 3) {
        local_1b0 = lVar9;
        for (lVar13 = 0; (ulong)(coordType == COORDTYPE_BASIC) * 0x10 + 0x10 != lVar13;
            lVar13 = lVar13 + 0x10) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
          poVar7 = std::operator<<((ostream *)&name,init::minFilterModes[lVar10].name);
          poVar7 = std::operator<<(poVar7,"_");
          std::operator<<(poVar7,init::wrapModes[lVar9].name);
          pcVar2 = *(char **)((long)&init::tex2DSizes[0].name + lVar13);
          if (pcVar2 != (char *)0x0) {
            poVar7 = std::operator<<((ostream *)&name,"_");
            std::operator<<(poVar7,pcVar2);
          }
          pTVar8 = (Texture2DMipmapCase *)operator_new(0x100);
          pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
          pCVar3 = (this->super_TestCaseGroup).m_context;
          pRVar4 = pCVar3->m_renderCtx;
          renderCtxInfo = pCVar3->m_contextInfo;
          std::__cxx11::stringbuf::str();
          Texture2DMipmapCase::Texture2DMipmapCase
                    (pTVar8,pTVar1,pRVar4,renderCtxInfo,local_1d8[0],"",coordType,
                     init::minFilterModes[lVar10].mode,init::wrapModes[lVar9].mode,
                     init::wrapModes[lVar9].mode,0x1908,0x1401,
                     *(int *)((long)&init::tex2DSizes[0].width + lVar13),0x40);
          tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
          std::__cxx11::string::~string((string *)local_1d8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        }
        lVar9 = local_1b0 + 1;
      }
      lVar10 = local_1b8 + 1;
    }
    lVar12 = lVar12 + 1;
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pTVar1,"bias","User-supplied bias value");
  tcu::TestNode::addChild(pTVar5,pTVar6);
  for (lVar12 = 0; lVar12 != 0x40; lVar12 = lVar12 + 0x10) {
    pTVar8 = (Texture2DMipmapCase *)operator_new(0x100);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    Texture2DMipmapCase::Texture2DMipmapCase
              (pTVar8,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               pCVar3->m_renderCtx,pCVar3->m_contextInfo,
               *(char **)((long)&init::minFilterModes[0].name + lVar12),"",COORDTYPE_BASIC_BIAS,
               *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar12),0x2901,0x2901,0x1908,
               0x1401,0x40,0x40);
    tcu::TestNode::addChild(pTVar6,(TestNode *)pTVar8);
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"generate",
             "Mipmap generation tests");
  tcu::TestNode::addChild(pTVar5,pTVar6);
  for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 0x10) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        std::operator<<((ostream *)&name,init::formats[lVar12].name);
        pcVar2 = init::tex2DSizes[lVar10].name;
        if (pcVar2 != (char *)0x0) {
          poVar7 = std::operator<<((ostream *)&name,"_");
          std::operator<<(poVar7,pcVar2);
        }
        poVar7 = std::operator<<((ostream *)&name,"_");
        std::operator<<(poVar7,*(char **)((long)&init::genHints[0].name + lVar9));
        this_00 = (Texture2DGenMipmapCase *)operator_new(0xf0);
        pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
        pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
        std::__cxx11::stringbuf::str();
        Texture2DGenMipmapCase::Texture2DGenMipmapCase
                  (this_00,pTVar1,pRVar4,local_1d8[0],"",init::formats[lVar12].format,
                   init::formats[lVar12].dataType,
                   *(deUint32 *)((long)&init::genHints[0].hint + lVar9),
                   init::tex2DSizes[lVar10].width,0x40);
        tcu::TestNode::addChild(pTVar6,(TestNode *)this_00);
        std::__cxx11::string::~string((string *)local_1d8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
      }
    }
  }
  lVar12 = 0;
  while( true ) {
    pTVar5 = (TestNode *)operator_new(0x70);
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    if (lVar12 == 3) break;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,pTVar1,init::cubeCoordTypes[lVar12].name,
               init::cubeCoordTypes[lVar12].desc);
    tcu::TestNode::addChild(node,pTVar5);
    for (lVar10 = 0; lVar10 != 0x40; lVar10 = lVar10 + 0x10) {
      this_01 = (TextureCubeMipmapCase *)operator_new(0x100);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      TextureCubeMipmapCase::TextureCubeMipmapCase
                (this_01,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 pCVar3->m_renderCtx,pCVar3->m_contextInfo,
                 *(char **)((long)&init::minFilterModes[0].name + lVar10),"",
                 init::cubeCoordTypes[lVar12].type,
                 *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar10),0x812f,0x812f,0x1908,
                 0x1401,0x40);
      tcu::TestNode::addChild(pTVar5,(TestNode *)this_01);
    }
    lVar12 = lVar12 + 1;
  }
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pTVar1,"generate","Mipmap generation tests");
  tcu::TestNode::addChild(node,pTVar5);
  paVar11 = extraout_RAX;
  for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
    paVar11 = init::formats;
    for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 0x10) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
      poVar7 = std::operator<<((ostream *)&name,init::formats[lVar12].name);
      poVar7 = std::operator<<(poVar7,"_");
      std::operator<<(poVar7,*(char **)((long)&init::genHints[0].name + lVar10));
      this_02 = (TextureCubeGenMipmapCase *)operator_new(0xe8);
      pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      pRVar4 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
      std::__cxx11::stringbuf::str();
      TextureCubeGenMipmapCase::TextureCubeGenMipmapCase
                (this_02,pTVar1,pRVar4,local_1d8[0],"",init::formats[lVar12].format,
                 init::formats[lVar12].dataType,
                 *(deUint32 *)((long)&init::genHints[0].hint + lVar10),0x40);
      tcu::TestNode::addChild(pTVar5,(TestNode *)this_02);
      std::__cxx11::string::~string((string *)local_1d8);
      paVar11 = (anon_struct_16_3_5cb0d78b *)
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
    }
  }
  return (int)paVar11;
}

Assistant:

void TextureMipmapTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Mipmapping");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Filtering");
	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_nearest",		GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_linear",		GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_linear",		GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} coordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_AFFINE,		"affine",		"Mipmapping with affine coordinate transform"		},
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			}
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
		deUint32		dataType;
	} formats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "la88",		GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba5551",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	static const struct
	{
		const char*		name;
		deUint32		hint;
	} genHints[] =
	{
		{ "fastest",	GL_FASTEST },
		{ "nicest",		GL_NICEST }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} tex2DSizes[] =
	{
		{ DE_NULL,		64, 64 }, // Default.
		{ "non_square",	32, 64 }
	};

	// 2D cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, coordTypes[coordType].name, coordTypes[coordType].desc);
		group2D->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
			{
				// Add non_square variants to basic cases only.
				int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex2DSizes) : 1;

				for (int size = 0; size < sizeEnd; size++)
				{
					std::ostringstream name;
					name << minFilterModes[minFilter].name
						 << "_" << wrapModes[wrapMode].name;

					if (tex2DSizes[size].name)
						name << "_" << tex2DSizes[size].name;

					coordTypeGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
																	 name.str().c_str(), "",
																	 coordTypes[coordType].type,
																	 minFilterModes[minFilter].mode,
																	 wrapModes[wrapMode].mode,
																	 wrapModes[wrapMode].mode,
																	 GL_RGBA, GL_UNSIGNED_BYTE,
																	 tex2DSizes[size].width, tex2DSizes[size].height));
				}
			}
		}
	}

	// 2D bias variants.
	{
		tcu::TestCaseGroup* biasGroup = new tcu::TestCaseGroup(m_testCtx, "bias", "User-supplied bias value");
		group2D->addChild(biasGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			biasGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
														minFilterModes[minFilter].name, "",
														COORDTYPE_BASIC_BIAS,
														minFilterModes[minFilter].mode,
														GL_REPEAT, GL_REPEAT,
														GL_RGBA, GL_UNSIGNED_BYTE,
														tex2DSizes[0].width, tex2DSizes[0].height));
	}

	// 2D mipmap generation variants.
	{
		tcu::TestCaseGroup* genMipmapGroup = new tcu::TestCaseGroup(m_testCtx, "generate", "Mipmap generation tests");
		group2D->addChild(genMipmapGroup);

		for (int format = 0; format < DE_LENGTH_OF_ARRAY(formats); format++)
		{
			for (int size = 0; size < DE_LENGTH_OF_ARRAY(tex2DSizes); size++)
			{
				for (int hint = 0; hint < DE_LENGTH_OF_ARRAY(genHints); hint++)
				{
					std::ostringstream name;
					name << formats[format].name;

					if (tex2DSizes[size].name)
						name << "_" << tex2DSizes[size].name;

					name << "_" << genHints[hint].name;

					genMipmapGroup->addChild(new Texture2DGenMipmapCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "",
																		formats[format].format, formats[format].dataType, genHints[hint].hint,
																		tex2DSizes[size].width, tex2DSizes[size].height));
				}
			}
		}
	}

	const int cubeMapSize = 64;

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} cubeCoordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			},
		{ COORDTYPE_BASIC_BIAS,	"bias",			"User-supplied bias value"							}
	};

	// Cubemap cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(cubeCoordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, cubeCoordTypes[coordType].name, cubeCoordTypes[coordType].desc);
		groupCube->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			coordTypeGroup->addChild(new TextureCubeMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															   minFilterModes[minFilter].name, "",
															   cubeCoordTypes[coordType].type,
															   minFilterModes[minFilter].mode,
															   GL_CLAMP_TO_EDGE,
															   GL_CLAMP_TO_EDGE,
															   GL_RGBA, GL_UNSIGNED_BYTE, cubeMapSize));
		}
	}

	// Cubemap mipmap generation variants.
	{
		tcu::TestCaseGroup* genMipmapGroup = new tcu::TestCaseGroup(m_testCtx, "generate", "Mipmap generation tests");
		groupCube->addChild(genMipmapGroup);

		for (int format = 0; format < DE_LENGTH_OF_ARRAY(formats); format++)
		{
			for (int hint = 0; hint < DE_LENGTH_OF_ARRAY(genHints); hint++)
			{
				std::ostringstream name;
				name << formats[format].name
					 << "_" << genHints[hint].name;

				genMipmapGroup->addChild(new TextureCubeGenMipmapCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "", formats[format].format, formats[format].dataType, genHints[hint].hint, cubeMapSize));
			}
		}
	}
}